

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O0

BtorSimBitVector * btorsim_bv_redand(BtorSimBitVector *bv)

{
  BtorSimBitVector *bv_00;
  uint *in_RDI;
  bool bVar1;
  BtorSimBitVector *res;
  uint32_t mask0;
  uint32_t bit;
  uint32_t i;
  undefined8 in_stack_ffffffffffffffe0;
  uint local_14;
  uint32_t local_10;
  uint local_c;
  
  bv_00 = btorsim_bv_new((uint32_t)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if ((ulong)*in_RDI == (ulong)in_RDI[1] << 5) {
    local_14 = 0xffffffff;
  }
  else {
    local_14 = 0x7fffffff >> (0x1f - ((byte)*in_RDI & 0x1f) & 0x1f);
  }
  local_10 = (uint32_t)(in_RDI[2] == local_14);
  local_c = 1;
  while( true ) {
    bVar1 = false;
    if (local_10 != 0) {
      bVar1 = local_c < in_RDI[1];
    }
    if (!bVar1) break;
    if (in_RDI[(ulong)local_c + 2] != 0xffffffff) {
      local_10 = 0;
    }
    local_c = local_c + 1;
  }
  btorsim_bv_set_bit(bv_00,0,local_10);
  return bv_00;
}

Assistant:

BtorSimBitVector *
btorsim_bv_redand (const BtorSimBitVector *bv)
{
  assert (bv);

  uint32_t i;
  uint32_t bit;
  uint32_t mask0;
  BtorSimBitVector *res;

  res = btorsim_bv_new (1);
  assert (rem_bits_zero_dbg (res));

  if (bv->width == BTORSIM_BV_TYPE_BW * bv->len)
    mask0 = ~(BTORSIM_BV_TYPE) 0;
  else
    mask0 = BTOR2_MASK_REM_BITS (bv);

  bit = (bv->bits[0] == mask0);

  for (i = 1; bit && i < bv->len; i++)
    if (bv->bits[i] != ~(BTORSIM_BV_TYPE) 0) bit = 0;

  btorsim_bv_set_bit (res, 0, bit);

  assert (rem_bits_zero_dbg (res));
  return res;
}